

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O2

string * __thiscall
spvtools::opt::SSARewriter::PhiCandidate::PrettyPrint_abi_cxx11_
          (string *__return_storage_ptr__,PhiCandidate *this,CFG *cfg)

{
  pointer puVar1;
  uint32_t blk_id;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  char *pcVar4;
  pointer puVar5;
  ostringstream str;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"%");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," = Phi[%");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,", BB %");
  BasicBlock::id(this->bb_);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"](");
  if ((this->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    blk_id = BasicBlock::id(this->bb_);
    pvVar3 = CFG::preds(cfg,blk_id);
    puVar1 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar5 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
      poVar2 = std::operator<<((ostream *)local_1a8,"[%");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,", bb(%");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,")] ");
    }
  }
  std::operator<<((ostream *)local_1a8,")");
  if (this->copy_of_ != 0) {
    poVar2 = std::operator<<((ostream *)local_1a8,"  [COPY OF ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"]");
  }
  pcVar4 = "  [INCOMPLETE]";
  if (this->is_complete_ != false) {
    pcVar4 = "  [COMPLETE]";
  }
  std::operator<<((ostream *)local_1a8,pcVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string SSARewriter::PhiCandidate::PrettyPrint(const CFG* cfg) const {
  std::ostringstream str;
  str << "%" << result_id_ << " = Phi[%" << var_id_ << ", BB %" << bb_->id()
      << "](";
  if (phi_args_.size() > 0) {
    uint32_t arg_ix = 0;
    for (uint32_t pred_label : cfg->preds(bb_->id())) {
      uint32_t arg_id = phi_args_[arg_ix++];
      str << "[%" << arg_id << ", bb(%" << pred_label << ")] ";
    }
  }
  str << ")";
  if (copy_of_ != 0) {
    str << "  [COPY OF " << copy_of_ << "]";
  }
  str << ((is_complete_) ? "  [COMPLETE]" : "  [INCOMPLETE]");

  return str.str();
}